

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetfil.cpp
# Opt level: O2

int CVmNetFile::exists(char *fname,int sfid)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  CVmNetFile *this;
  
  iVar1 = open(fname,sfid,0,0xb,0);
  this = (CVmNetFile *)CONCAT44(extraout_var,iVar1);
  if (this->srvfname == (char *)0x0) {
    iVar1 = access(this->lclfname,0);
    uVar2 = (uint)(iVar1 == 0);
  }
  else {
    uVar2 = server_file_check(this->srvfname,"R");
  }
  abandon(this);
  return uVar2;
}

Assistant:

int CVmNetFile::exists(VMG_ const char *fname, int sfid)
{
    /* create a no-op descriptor for the file */
    CVmNetFile *nf = open(vmg_ fname, sfid, 0, OSFTUNK, 0);

    /* 
     *   if it's a network file, check with the server; otherwise check the
     *   local file system 
     */
    int ret = (nf->is_net_file()
               ? server_file_check(vmg_ nf->srvfname, "R")
               : !osfacc(nf->lclfname));

    /* done with the descriptor */
    nf->abandon(vmg0_);

    /* return the result */
    return ret;
}